

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

allocator_base<std::allocator<unsigned_char>_> * __thiscall
poly::vector_impl::allocator_base<std::allocator<unsigned_char>_>::copy_assign_impl
          (allocator_base<std::allocator<unsigned_char>_> *this,
          allocator_base<std::allocator<unsigned_char>_> *a)

{
  difference_type dVar1;
  allocator_type *this_00;
  size_type __n;
  uchar *local_28;
  pointer s;
  allocator_base<std::allocator<unsigned_char>_> *a_local;
  allocator_base<std::allocator<unsigned_char>_> *this_local;
  
  local_28 = (uchar *)0x0;
  dVar1 = size(a);
  if (dVar1 != 0) {
    this_00 = get_allocator_ref(this);
    __n = size(a);
    local_28 = __gnu_cxx::new_allocator<unsigned_char>::allocate
                         ((new_allocator<unsigned_char> *)this_00,__n,(void *)0x0);
  }
  tidy(this);
  this->_storage = local_28;
  dVar1 = size(a);
  this->_end_storage = local_28 + dVar1;
  return this;
}

Assistant:

allocator_base& copy_assign_impl(const allocator_base& a, std::false_type /*unused*/)
        {
            pointer s = nullptr;
            if (a.size()) {
                s = get_allocator_ref().allocate(a.size());
            }
            tidy();
            _storage     = s;
            _end_storage = s + a.size();
            return *this;
        }